

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
           *this,int value)

{
  int iVar1;
  undefined8 in_RAX;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar2;
  uint32_t n;
  undefined8 uStack_28;
  
  n = -value;
  if (0 < value) {
    n = value;
  }
  uStack_28 = in_RAX;
  iVar1 = internal::count_digits(n);
  if (value < 0) {
    uStack_28 = CONCAT44(0x2d,(undefined4)uStack_28);
    std::vector<wchar_t,_std::allocator<wchar_t>_>::emplace_back<wchar_t>
              ((this->out_).container,(wchar_t *)((long)&uStack_28 + 4));
  }
  bVar2 = internal::
          format_decimal<wchar_t,unsigned_int,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,fmt::v5::internal::no_thousands_sep>
                    ((this->out_).container,n,iVar1);
  (this->out_).container = bVar2.container;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }